

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg,ImGuiItemFlags extra_flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint in_ECX;
  ImVec2 *in_RDX;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  bool is_clipped;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *local_48;
  ImGuiID in_stack_ffffffffffffffc4;
  ImGuiWindow *bb_00;
  undefined1 clip;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  pIVar1 = GImGui;
  bb_00 = GImGui->CurrentWindow;
  (GImGui->LastItemData).ID = in_ESI;
  (pIVar1->LastItemData).Rect.Min = *in_RDI;
  (pIVar1->LastItemData).Rect.Max = in_RDI[1];
  local_48 = in_RDI;
  if (in_RDX != (ImVec2 *)0x0) {
    local_48 = in_RDX;
  }
  (pIVar1->LastItemData).NavRect.Min = *local_48;
  (pIVar1->LastItemData).NavRect.Max = local_48[1];
  (pIVar1->LastItemData).InFlags = pIVar1->CurrentItemFlags | in_ECX;
  (pIVar1->LastItemData).StatusFlags = 0;
  if (((in_ESI != 0) &&
      ((((bb_00->DC).NavLayersActiveMaskNext =
              (bb_00->DC).NavLayersActiveMaskNext |
              (ushort)(1 << ((byte)(bb_00->DC).NavLayerCurrent & 0x1f)), pIVar1->NavId == in_ESI ||
        ((pIVar1->NavAnyRequest & 1U) != 0)) &&
       (pIVar1->NavWindow->RootWindowForNav == bb_00->RootWindowForNav)))) &&
     ((bb_00 == pIVar1->NavWindow || (((bb_00->Flags | pIVar1->NavWindow->Flags) & 0x800000U) != 0))
     )) {
    NavProcessItem();
  }
  clip = (undefined1)(in_ESI >> 0x18);
  (pIVar1->NextItemData).Flags = 0;
  bVar2 = IsClippedEx((ImRect *)bb_00,in_stack_ffffffffffffffc4);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    bVar2 = IsMouseHoveringRect((ImVec2 *)
                                CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI
                                ,(bool)clip);
    if (bVar2) {
      (pIVar1->LastItemData).StatusFlags = (pIVar1->LastItemData).StatusFlags | 1;
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg, ImGuiItemFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Set item data
    // (DisplayRect is left untouched, made valid when ImGuiItemStatusFlags_HasDisplayRect is set)
    g.LastItemData.ID = id;
    g.LastItemData.Rect = bb;
    g.LastItemData.NavRect = nav_bb_arg ? *nav_bb_arg : bb;
    g.LastItemData.InFlags = g.CurrentItemFlags | extra_flags;
    g.LastItemData.StatusFlags = ImGuiItemStatusFlags_None;

    // Directional navigation processing
    if (id != 0)
    {
        // Runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        window->DC.NavLayersActiveMaskNext |= (1 << window->DC.NavLayerCurrent);
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem();

        // [DEBUG] People keep stumbling on this problem and using "" as identifier in the root of a window instead of "##something".
        // Empty identifier are valid and useful in a small amount of cases, but 99.9% of the time you want to use "##something".
        // READ THE FAQ: https://dearimgui.org/faq
        IM_ASSERT(id != window->ID && "Cannot have an empty ID at the root of a window. If you need an empty label, use ## and read the FAQ about how the ID Stack works!");

        // [DEBUG] Item Picker tool, when enabling the "extended" version we perform the check in ItemAdd()
#ifdef IMGUI_DEBUG_TOOL_ITEM_PICKER_EX
        if (id == g.DebugItemPickerBreakId)
        {
            IM_DEBUG_BREAK();
            g.DebugItemPickerBreakId = 0;
        }
#endif
    }
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}